

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManBfsForCrossCut(Gia_Man_t *p)

{
  void *pvVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Vec_t *__ptr;
  int iVar6;
  long lVar7;
  long lVar8;
  
  iVar4 = p->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar6 = iVar4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar5;
  __ptr = Gia_ManLevelize(p);
  iVar4 = __ptr->nSize;
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      pvVar1 = __ptr->pArray[lVar8];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar7 = 0;
        do {
          pGVar2 = *(Gia_Obj_t **)(*(long *)((long)pvVar1 + 8) + lVar7 * 8);
          pGVar3 = p->pObjs;
          if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00,(int)((ulong)((long)pGVar2 - (long)pGVar3) >> 2) * -0x55555555);
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)pvVar1 + 4));
        iVar4 = __ptr->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
    if (0 < iVar4) {
      lVar8 = 0;
      do {
        pvVar1 = __ptr->pArray[lVar8];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar4 = __ptr->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar4);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManBfsForCrossCut( Gia_Man_t * p )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_Vec_t * vLevels = Gia_ManLevelize( p );
    Vec_Ptr_t * vObjs;
    Gia_Obj_t * pObj;
    int i, k;
    Vec_VecForEachLevel( vLevels, vObjs, i )
        Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, k )
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    Vec_VecFree( vLevels );
    return vNodes;
}